

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

int lws_role_call_adoption_bind(lws *wsi,int type,char *prot)

{
  lws_vhost *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  lws_role_ops *plVar5;
  lws_log_cx *plVar6;
  lws_role_ops **pplVar7;
  uint type_00;
  lws_role_ops *ar;
  char *local_38;
  
  plVar1 = (wsi->a).vhost;
  local_38 = prot;
  type_00 = type;
  if (((plVar1->options & 0x400000) == 0) || (plVar1->listen_accept_role == (char *)0x0))
  goto LAB_0011213b;
  plVar5 = lws_role_by_name(plVar1->listen_accept_role);
  if (prot == (char *)0x0) {
    local_38 = plVar1->listen_accept_protocol;
  }
  if (plVar5 == (lws_role_ops *)0x0) {
    plVar6 = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(plVar6,lws_log_prepend_wsi,wsi,1,"lws_role_call_adoption_bind",
                "can\'t find role \'%s\'",((wsi->a).vhost)->listen_accept_role);
  }
  iVar3 = strcmp(((wsi->a).vhost)->listen_accept_role,"raw-proxy");
  type_00 = type | 0x20;
  if (iVar3 != 0) {
    type_00 = type;
  }
  if ((plVar5 == (lws_role_ops *)0x0) || ((plVar5->rops_idx[8] & 0xf) == 0)) {
LAB_001120db:
    plVar6 = lwsl_wsi_get_cx(wsi);
    if ((type_00 >> 0x18 & 1) == 0) {
      _lws_log_cx(plVar6,lws_log_prepend_wsi,wsi,2,"lws_role_call_adoption_bind",
                  "adoption bind to role \'%s\', protocol \'%s\', type 0x%x, failed",
                  ((wsi->a).vhost)->listen_accept_role,local_38,type_00);
      bVar2 = true;
    }
    else {
      bVar2 = false;
      _lws_log_cx(plVar6,lws_log_prepend_wsi,wsi,0x10,"lws_role_call_adoption_bind",
                  "leaving bound to role %s",wsi->role_ops->name);
      type = 0;
    }
  }
  else {
    iVar3 = (*plVar5->rops_table[(plVar5->rops_idx[8] & 0xf) - 1].check_upgrades)(wsi);
    type = 0;
    if (iVar3 < 0) {
      type = -1;
    }
    else if (iVar3 == 0) goto LAB_001120db;
    bVar2 = false;
  }
  if (!bVar2) {
    return type;
  }
LAB_0011213b:
  pplVar7 = available_roles;
  do {
    plVar5 = *pplVar7;
    if (plVar5 == (lws_role_ops *)0x0) break;
    if ((plVar5->rops_idx[8] & 0xf) == 0) {
LAB_0011217a:
      bVar2 = true;
      iVar3 = type;
    }
    else {
      iVar4 = (*plVar5->rops_table[(plVar5->rops_idx[8] & 0xf) - 1].check_upgrades)(wsi);
      bVar2 = false;
      iVar3 = 0;
      if (iVar4 == 0) goto LAB_0011217a;
    }
    type = iVar3;
    pplVar7 = pplVar7 + 1;
  } while (bVar2);
  if (plVar5 == (lws_role_ops *)0x0) {
    iVar3 = rops_adoption_bind_raw_skt(wsi,type_00,local_38);
    type = 0;
    if (iVar3 == 0) {
      plVar6 = lwsl_wsi_get_cx(wsi);
      type = 0;
      _lws_log_cx(plVar6,lws_log_prepend_wsi,wsi,4,"lws_role_call_adoption_bind",
                  "falling back to raw file role bind");
      iVar3 = rops_adoption_bind_raw_file(wsi,type_00,local_38);
      if (iVar3 == 0) {
        type = 1;
      }
    }
  }
  return type;
}

Assistant:

int
lws_role_call_adoption_bind(struct lws *wsi, int type, const char *prot)
{
	int n;

	/*
	 * if the vhost is told to bind accepted sockets to a given role,
	 * then look it up by name and try to bind to the specific role.
	 */
	if (lws_check_opt(wsi->a.vhost->options,
			  LWS_SERVER_OPTION_ADOPT_APPLY_LISTEN_ACCEPT_CONFIG) &&
	    wsi->a.vhost->listen_accept_role) {
		const struct lws_role_ops *role =
			lws_role_by_name(wsi->a.vhost->listen_accept_role);

		if (!prot)
			prot = wsi->a.vhost->listen_accept_protocol;

		if (!role)
			lwsl_wsi_err(wsi, "can't find role '%s'",
					  wsi->a.vhost->listen_accept_role);

		if (!strcmp(wsi->a.vhost->listen_accept_role, "raw-proxy"))
			type |= LWS_ADOPT_FLAG_RAW_PROXY;

		if (role && lws_rops_fidx(role, LWS_ROPS_adoption_bind)) {
			n = (lws_rops_func_fidx(role, LWS_ROPS_adoption_bind)).
						adoption_bind(wsi, type, prot);
			if (n < 0)
				return -1;
			if (n) /* did the bind */
				return 0;
		}

		if (type & _LWS_ADOPT_FINISH) {
			lwsl_wsi_debug(wsi, "leaving bound to role %s",
					    wsi->role_ops->name);
			return 0;
		}

		lwsl_wsi_warn(wsi, "adoption bind to role '%s', "
			  "protocol '%s', type 0x%x, failed",
			  wsi->a.vhost->listen_accept_role, prot, type);
	}

	/*
	 * Otherwise ask each of the roles in order of preference if they
	 * want to bind to this accepted socket
	 */

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (lws_rops_fidx(ar, LWS_ROPS_adoption_bind) &&
		    (lws_rops_func_fidx(ar, LWS_ROPS_adoption_bind)).
					    adoption_bind(wsi, type, prot))
			return 0;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	/* fall back to raw socket role if, eg, h1 not configured */

	if (lws_rops_fidx(&role_ops_raw_skt, LWS_ROPS_adoption_bind) &&
	    (lws_rops_func_fidx(&role_ops_raw_skt, LWS_ROPS_adoption_bind)).
				    adoption_bind(wsi, type, prot))
		return 0;

#if defined(LWS_ROLE_RAW_FILE)

	lwsl_wsi_notice(wsi, "falling back to raw file role bind");

	/* fall back to raw file role if, eg, h1 not configured */

	if (lws_rops_fidx(&role_ops_raw_file, LWS_ROPS_adoption_bind) &&
	    (lws_rops_func_fidx(&role_ops_raw_file, LWS_ROPS_adoption_bind)).
				    adoption_bind(wsi, type, prot))
		return 0;
#endif

	return 1;
}